

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O1

char * __thiscall
Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::AllocPages<false>
          (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *this,uint pageCount)

{
  PageBitVector *this_00;
  SecondaryAllocator *pSVar1;
  PageAllocatorBaseCommon *pPVar2;
  HANDLE pVVar3;
  code *pcVar4;
  bool bVar5;
  BOOLEAN BVar6;
  BVIndex BVar7;
  int iVar8;
  uint index;
  uint uVar9;
  uint index_00;
  BOOL BVar10;
  undefined4 *puVar11;
  HANDLE pVVar12;
  AllocatorType *pAVar13;
  BVIndex BVar14;
  char *pcVar15;
  ulong uVar16;
  DWORD local_4c;
  char *pcStack_48;
  DWORD oldProtect;
  char *local_40;
  uint local_38;
  BOOL local_34;
  
  if (this->freePageCount == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x152,"(freePageCount != 0)","freePageCount != 0");
    if (!bVar5) goto LAB_00712145;
    *puVar11 = 0;
  }
  BVar14 = this->freePageCount;
  this_00 = &this->freePages;
  BVar7 = BVStatic<272UL>::Count(this_00);
  if (BVar14 != BVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x153,"(freePageCount == (uint)this->GetCountOfFreePages())",
                       "freePageCount == (uint)this->GetCountOfFreePages()");
    if (!bVar5) goto LAB_00712145;
    *puVar11 = 0;
  }
  if (this->freePageCount < pageCount) {
LAB_00711dbf:
    pcStack_48 = (char *)0x0;
  }
  else {
    if ((this->freePageCount == 0 && this->decommitPageCount == 0) ||
       ((pSVar1 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).
                  secondaryAllocator, pSVar1 != (SecondaryAllocator *)0x0 &&
        (iVar8 = (*pSVar1->_vptr_SecondaryAllocator[3])(), (char)iVar8 == '\0')))) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x158,"(!IsFull())","!IsFull()");
      if (!bVar5) {
LAB_00712145:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar11 = 0;
    }
    index = BVStatic<272UL>::GetNextBit(this_00,0);
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    pcStack_48 = (char *)(ulong)(pageCount << 0xc);
    local_38 = index;
    do {
      while( true ) {
        if (index == 0xffffffff) goto LAB_00711dbf;
        pPVar2 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).
                 super_SegmentBaseCommon.allocator;
        pAVar13 = &pPVar2[-1].allocatorType;
        if (pPVar2 == (PageAllocatorBaseCommon *)0x0) {
          pAVar13 = (AllocatorType *)0x0;
        }
        if (pAVar13[0x28] <= index) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar11 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                             ,0x15d,"(index < this->GetAllocator()->GetMaxAllocPageCount())",
                             "index < this->GetAllocator()->GetMaxAllocPageCount()");
          if (!bVar5) goto LAB_00712145;
          *puVar11 = 0;
        }
        uVar9 = GetAvailablePageCount(this);
        if (uVar9 - index < pageCount) goto LAB_00711dbf;
        index_00 = local_38;
        if ((pageCount == 1) ||
           (BVar6 = BVStatic<272UL>::TestRange(this_00,index,pageCount), index_00 = index,
           BVar6 != '\0')) break;
        index = BVStatic<272UL>::GetNextBit(this_00,index + 1);
      }
      pcVar15 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).address +
                (index_00 << 0xc);
      if (pageCount < 2) {
LAB_00711fba:
        local_40 = pcVar15;
        local_38 = index_00;
        BVStatic<272UL>::ClearRange(this_00,index_00,pageCount);
        BVar7 = this->freePageCount - pageCount;
        this->freePageCount = BVar7;
        BVar14 = BVStatic<272UL>::Count(this_00);
        if (BVar7 != BVar14) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar11 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                             ,0x177,"(freePageCount == (uint)this->GetCountOfFreePages())",
                             "freePageCount == (uint)this->GetCountOfFreePages()");
          if (!bVar5) goto LAB_00712145;
          *puVar11 = 0;
        }
        pPVar2 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).
                 super_SegmentBaseCommon.allocator;
        pAVar13 = &pPVar2[-1].allocatorType;
        if (pPVar2 == (PageAllocatorBaseCommon *)0x0) {
          pAVar13 = (AllocatorType *)0x0;
        }
        pVVar3 = *(HANDLE *)(pAVar13 + 0x4a);
        pVVar12 = GetCurrentProcess();
        index_00 = local_38;
        if (pVVar3 == pVVar12) {
          BVar10 = VirtualProtect(local_40,(SIZE_T)(ulong)(pageCount << 0xc),4,&local_4c);
          if (BVar10 == 0) {
            AssertCount = AssertCount + 1;
            local_34 = BVar10;
            Js::Throw::LogAssert();
            *puVar11 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                               ,0x180,"((0))","UNREACHED");
            if (!bVar5) goto LAB_00712145;
            pcStack_48 = (char *)0x0;
LAB_0071211b:
            *puVar11 = 0;
            BVar10 = local_34;
          }
          else if (local_4c != 1) {
            AssertCount = AssertCount + 1;
            local_34 = BVar10;
            Js::Throw::LogAssert();
            *puVar11 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                               ,0x183,"(oldProtect == 0x01)","oldProtect == PAGE_NOACCESS");
            if (bVar5) goto LAB_0071211b;
            goto LAB_00712145;
          }
          if (BVar10 == 0) {
            iVar8 = 1;
            goto LAB_0071212c;
          }
        }
        iVar8 = 1;
        pcStack_48 = local_40;
      }
      else {
        iVar8 = 0;
        uVar16 = (ulong)pageCount * 0x1000 - 1 & (ulong)pcVar15;
        if (uVar16 != 0) {
          BVar14 = (int)((ulong)pcVar15 % ((ulong)pageCount * 0x1000) >> 0xc) + index_00;
          pPVar2 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).
                   super_SegmentBaseCommon.allocator;
          pAVar13 = &pPVar2[-1].allocatorType;
          if (pPVar2 == (PageAllocatorBaseCommon *)0x0) {
            pAVar13 = (AllocatorType *)0x0;
          }
          if (BVar14 < pAVar13[0x28]) {
            local_40 = pcVar15;
            index_00 = BVStatic<272UL>::GetNextBit(this_00,BVar14);
            iVar8 = 8;
            pcVar15 = local_40;
          }
          else {
            iVar8 = 1;
            pcStack_48 = (char *)0x0;
          }
        }
        if (uVar16 == 0) goto LAB_00711fba;
      }
LAB_0071212c:
      index = index_00;
      local_38 = index_00;
    } while (iVar8 == 8);
  }
  return pcStack_48;
}

Assistant:

char *
PageSegmentBase<T>::AllocPages(uint pageCount)
{
    Assert(freePageCount != 0);
    Assert(freePageCount == (uint)this->GetCountOfFreePages());
    if (freePageCount < pageCount)
    {
        return nullptr;
    }
    Assert(!IsFull());

    uint index = this->GetNextBitInFreePagesBitVector(0);
    while (index != -1)
    {
        Assert(index < this->GetAllocator()->GetMaxAllocPageCount());

        if (GetAvailablePageCount() - index < pageCount)
        {
            break;
        }
        if (pageCount == 1 || this->TestRangeInFreePagesBitVector(index, pageCount))
        {
            char * allocAddress = this->address + index * AutoSystemInfo::PageSize;

            if (pageCount > 1 && !notPageAligned)
            {
                uint nextIndex = 0;
                if (!IsAllocationPageAligned(allocAddress, pageCount, &nextIndex))
                {
                    if (index + nextIndex >= this->GetAllocator()->GetMaxAllocPageCount())
                    {
                        return nullptr;
                    }
                    index = this->freePages.GetNextBit(index + nextIndex);
                    continue;
                }
            }

            this->ClearRangeInFreePagesBitVector(index, pageCount);
            freePageCount -= pageCount;
            Assert(freePageCount == (uint)this->GetCountOfFreePages());

#ifdef PAGEALLOCATOR_PROTECT_FREEPAGE
            if (this->GetAllocator()->processHandle == GetCurrentProcess())
            {
                DWORD oldProtect;
                BOOL vpresult = VirtualProtect(allocAddress, pageCount * AutoSystemInfo::PageSize, PAGE_READWRITE, &oldProtect);
                if (vpresult == FALSE)
                {
                    Assert(UNREACHED);
                    return nullptr;
                }
                Assert(oldProtect == PAGE_NOACCESS);
            }
#endif
            return allocAddress;
        }
        index = this->GetNextBitInFreePagesBitVector(index + 1);
    }
    return nullptr;
}